

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ships.cpp
# Opt level: O0

bool val_positioning(Board *board,int row,int col,Ship ship)

{
  undefined1 local_19;
  bool control;
  int col_local;
  int row_local;
  Board *board_local;
  
  local_19 = false;
  if (ship.orientation == 'H') {
    local_19 = aux_positioning_horizontal(board,row,col,ship);
  }
  else if (ship.orientation == 'V') {
    local_19 = aux_positioning_vertical(board,row,col,ship);
  }
  return local_19;
}

Assistant:

bool val_positioning( Board *board, int row, int col, Ship ship )
{
    bool control = false;

    if( ship.orientation == 'H' )
    {
        control = aux_positioning_horizontal( board, row, col, ship );
    }

    else if( ship.orientation == 'V' )
    {
        control = aux_positioning_vertical( board, row, col, ship );
    }

    return control;
}